

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleVector.h
# Opt level: O0

void __thiscall
SimpleVector<MiniScript::InputBufferEntry>::resizeBuffer
          (SimpleVector<MiniScript::InputBufferEntry> *this,long n)

{
  InputBufferEntry *pIVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  InputBufferEntry *pIVar4;
  unsigned_long local_50;
  InputBufferEntry *end;
  InputBufferEntry *dest;
  InputBufferEntry *src;
  InputBufferEntry *newbuf;
  long n_local;
  SimpleVector<MiniScript::InputBufferEntry> *this_local;
  
  if (n != this->mBufItems) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = n;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pIVar4 = (InputBufferEntry *)operator_new__(uVar3);
    if (this->mBuf != (InputBufferEntry *)0x0) {
      pIVar1 = this->mBuf;
      local_50 = n;
      if ((long)this->mQtyItems < n) {
        local_50 = this->mQtyItems;
      }
      end = pIVar4;
      dest = this->mBuf;
      while (dest < pIVar1 + local_50) {
        *end = *dest;
        end = end + 1;
        dest = dest + 1;
      }
      if (this->mBuf != (InputBufferEntry *)0x0) {
        operator_delete__(this->mBuf);
      }
    }
    this->mBuf = pIVar4;
    this->mBufItems = n;
    if (this->mBufItems < this->mQtyItems) {
      this->mQtyItems = this->mBufItems;
    }
  }
  return;
}

Assistant:

inline void SimpleVector<T>::resizeBuffer(long n)
{
	if (n == (long)mBufItems) return;
	T *newbuf = new T[n];
//	if (!newbuf) throw memFullErr;	// (not needed, as new now throws if it fails)
	if (mBuf) {
		T* src = mBuf;
		T* dest = newbuf;
		T* end = &mBuf[((long)mQtyItems < n) ? mQtyItems : n];	// the smaller value
		while (src < end) {
			*dest++ = *src++;
		}
		delete[] mBuf;
	}
	mBuf = newbuf;
	mBufItems = n;
	if (mQtyItems > mBufItems) mQtyItems = mBufItems;
 }